

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode ServerNetworkLayerTCP_start(UA_ServerNetworkLayer *nl,UA_Logger logger)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  UA_StatusCode UVar4;
  char *msg;
  UA_Logger logger_00;
  char local_248 [8];
  char hostname [256];
  char discoveryUrl [256];
  undefined4 local_3c;
  undefined1 auStack_38 [4];
  int optval;
  UA_Byte *pUStack_30;
  
  pvVar1 = nl->handle;
  *(UA_Logger *)((long)pvVar1 + 0x18) = logger;
  _auStack_38 = 0;
  pUStack_30 = (UA_Byte *)0x0;
  iVar2 = gethostname(local_248,0xff);
  if (iVar2 == 0) {
    iVar2 = snprintf(hostname + 0xf8,0xff,"opc.tcp://%s:%d",local_248,
                     (ulong)*(ushort *)((long)pvVar1 + 0x14));
    _auStack_38 = (size_t)iVar2;
    pUStack_30 = (UA_Byte *)(hostname + 0xf8);
  }
  UA_String_copy((UA_String *)auStack_38,&nl->discoveryUrl);
  iVar2 = socket(2,1,0);
  if (iVar2 < 0) {
    UA_LOG_WARNING(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
                   "Error opening the server socket");
  }
  else {
    local_3c = 1;
    iVar3 = setsockopt(iVar2,1,2,&local_3c,4);
    if ((iVar3 == -1) || (UVar4 = socket_set_nonblocking(iVar2), UVar4 != 0)) {
      logger_00 = *(UA_Logger *)((long)pvVar1 + 0x18);
      msg = "Error during setting of server socket options";
    }
    else {
      hostname[0xf8] = '\x02';
      hostname[0xf9] = '\0';
      hostname._250_2_ =
           *(ushort *)((long)pvVar1 + 0x14) << 8 | *(ushort *)((long)pvVar1 + 0x14) >> 8;
      stack0xfffffffffffffebc = 0;
      iVar3 = bind(iVar2,(sockaddr *)(hostname + 0xf8),0x10);
      if (iVar3 < 0) {
        logger_00 = *(UA_Logger *)((long)pvVar1 + 0x18);
        msg = "Error during binding of the server socket";
      }
      else {
        iVar3 = listen(iVar2,100);
        if (-1 < iVar3) {
          *(int *)((long)pvVar1 + 0x20) = iVar2;
          UA_LOG_INFO(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
                      "TCP network layer listening on %.*s",(nl->discoveryUrl).length,
                      (nl->discoveryUrl).data);
          return 0;
        }
        logger_00 = *(UA_Logger *)((long)pvVar1 + 0x18);
        msg = "Error listening on server socket";
      }
    }
    UA_LOG_WARNING(logger_00,UA_LOGCATEGORY_NETWORK,msg);
    close(iVar2);
  }
  return 0x80020000;
}

Assistant:

static UA_StatusCode
ServerNetworkLayerTCP_start(UA_ServerNetworkLayer *nl, UA_Logger logger) {
    ServerNetworkLayerTCP *layer = nl->handle;
    layer->logger = logger;

    /* get the discovery url from the hostname */
    UA_String du = UA_STRING_NULL;
    char hostname[256];
    if(gethostname(hostname, 255) == 0) {
        char discoveryUrl[256];
#ifndef _MSC_VER
        du.length = (size_t)snprintf(discoveryUrl, 255, "opc.tcp://%s:%d",
                                     hostname, layer->port);
#else
        du.length = (size_t)_snprintf_s(discoveryUrl, 255, _TRUNCATE,
                                        "opc.tcp://%s:%d", hostname, layer->port);
#endif
        du.data = (UA_Byte*)discoveryUrl;
    }
    UA_String_copy(&du, &nl->discoveryUrl);

    /* Create the server socket */
    SOCKET newsock = socket(PF_INET, SOCK_STREAM, 0);
#ifdef _WIN32
    if(newsock == INVALID_SOCKET)
#else
    if(newsock < 0)
#endif
    {
        UA_LOG_WARNING(layer->logger, UA_LOGCATEGORY_NETWORK,
                       "Error opening the server socket");
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Set socket options */
    int optval = 1;
    if(setsockopt(newsock, SOL_SOCKET, SO_REUSEADDR,
                  (const char *)&optval, sizeof(optval)) == -1 ||
       socket_set_nonblocking(newsock) != UA_STATUSCODE_GOOD) {
        UA_LOG_WARNING(layer->logger, UA_LOGCATEGORY_NETWORK,
                       "Error during setting of server socket options");
        CLOSESOCKET(newsock);
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Bind socket to address */
    const struct sockaddr_in serv_addr = {
        .sin_family = AF_INET, .sin_addr.s_addr = INADDR_ANY,
        .sin_port = htons(layer->port), .sin_zero = {0}};
    if(bind(newsock, (const struct sockaddr *)&serv_addr, sizeof(serv_addr)) < 0) {
        UA_LOG_WARNING(layer->logger, UA_LOGCATEGORY_NETWORK,
                       "Error during binding of the server socket");
        CLOSESOCKET(newsock);
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Start listening */
    if(listen(newsock, MAXBACKLOG) < 0) {
        UA_LOG_WARNING(layer->logger, UA_LOGCATEGORY_NETWORK,
                       "Error listening on server socket");
        CLOSESOCKET(newsock);
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    layer->serversockfd = (UA_Int32)newsock; /* cast on win32 */
    UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                "TCP network layer listening on %.*s",
                nl->discoveryUrl.length, nl->discoveryUrl.data);
    return UA_STATUSCODE_GOOD;
}